

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateSolutionVectorLright
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *change,int j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,int *nnz)

{
  type_conflict5 tVar1;
  double local_30;
  
  local_30 = 0.0;
  tVar1 = boost::multiprecision::operator==(vec,&local_30);
  if (tVar1) {
    idx[*nnz] = j;
    *nnz = *nnz + 1;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            (&vec->m_backend,&change->m_backend);
  local_30 = 0.0;
  tVar1 = boost::multiprecision::operator==(vec,&local_30);
  if (tVar1) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)vec,1e-100);
  }
  return;
}

Assistant:

void inline CLUFactor<R>::updateSolutionVectorLright(R change, int j, R& vec, int* idx, int& nnz)
{
   // create a new entry in #ridx
   if(vec == 0.0)
   {
      assert(nnz < thedim);
      idx[nnz] = j;
      ++nnz;
   }

   vec -= change;

   // mark the entry where exact eliminiation occurred
   if(vec == 0.0)
      vec = SOPLEX_FACTOR_MARKER;
}